

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

int slow_bitmap_andnot(unsigned_long *dst,unsigned_long *bitmap1,unsigned_long *bitmap2,long bits)

{
  ulong uVar1;
  ulong local_40;
  unsigned_long result;
  long nr;
  long k;
  long bits_local;
  unsigned_long *bitmap2_local;
  unsigned_long *bitmap1_local;
  unsigned_long *dst_local;
  
  local_40 = 0;
  for (nr = 0; nr < (long)(bits + 0x3fU >> 6); nr = nr + 1) {
    uVar1 = bitmap1[nr] & (bitmap2[nr] ^ 0xffffffffffffffff);
    dst[nr] = uVar1;
    local_40 = uVar1 | local_40;
  }
  return (int)(local_40 != 0);
}

Assistant:

int slow_bitmap_andnot(unsigned long *dst, const unsigned long *bitmap1,
                       const unsigned long *bitmap2, long bits)
{
    long k;
    long nr = BITS_TO_LONGS(bits);
    unsigned long result = 0;

    for (k = 0; k < nr; k++) {
        result |= (dst[k] = bitmap1[k] & ~bitmap2[k]);
    }
    return result != 0;
}